

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void paste_objects_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object clipboard;
  Am_Object selection_widget;
  Am_Object group;
  Am_Value_List copy_clipboard_objs;
  Am_Value_List old_selection;
  Am_Value_List clipboard_objs;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Value_List local_70;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Value_List local_48;
  Am_Value_List local_38;
  Am_Value_List local_28;
  Am_Value_List local_18;
  
  local_88.data = (Am_Object_Data *)0x0;
  local_80.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_38);
  Am_Value_List::Am_Value_List(&local_58);
  Am_Value_List::Am_Value_List(&local_48);
  local_90.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(cmd,0x19d,0);
  Am_Object::operator=(&local_90,pAVar2);
  bVar1 = Am_Object::Valid(&local_90);
  if (!bVar1) {
    Am_Object::operator=(&local_90,&Am_Global_Clipboard);
  }
  Am_Object::Am_Object(&local_60,cmd);
  Am_Get_Selection_Widget_For_Command((Am_Object *)&local_70);
  Am_Object::operator=(&local_88,(Am_Object *)&local_70);
  Am_Object::~Am_Object((Am_Object *)&local_70);
  Am_Object::~Am_Object(&local_60);
  pAVar2 = Am_Object::Get(&local_88,0x193,0);
  Am_Object::operator=(&local_80,pAVar2);
  pAVar2 = Am_Object::Get(&local_90,0x169,0);
  Am_Value_List::operator=(&local_38,pAVar2);
  Am_Value_List::Am_Value_List(&local_18,&local_38);
  Am_Copy_Object_List(&local_70,(Am_Object *)&local_18,0x2eeef8);
  Am_Value_List::operator=(&local_58,&local_70);
  Am_Value_List::~Am_Value_List(&local_70);
  Am_Value_List::~Am_Value_List(&local_18);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  Am_Object::Set(cmd,0x16d,pAVar3,0);
  Am_Object::Set(cmd,0x16f,false,0);
  Am_Object::Am_Object(&local_78,&local_80);
  Am_Value_List::Am_Value_List(&local_28,&local_58);
  Am_Put_Objects_Into_Group(&local_78,&local_28);
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Object::~Am_Object(&local_78);
  pAVar2 = Am_Object::Get(&local_88,0x169,0);
  Am_Value_List::operator=(&local_48,pAVar2);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_48);
  Am_Object::Set(cmd,0x16c,pAVar3,0);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_58);
  Am_Object::Set(cmd,0x169,pAVar3,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  Am_Object::Set(cmd,0x171,pAVar3,0);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_58);
  Am_Object::Set(&local_88,0x169,pAVar3,0);
  Am_Object::~Am_Object(&local_90);
  Am_Value_List::~Am_Value_List(&local_48);
  Am_Value_List::~Am_Value_List(&local_58);
  Am_Value_List::~Am_Value_List(&local_38);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_88);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, paste_objects, (Am_Object cmd))
{
  Am_Object selection_widget, group;
  Am_Value_List clipboard_objs, copy_clipboard_objs, old_selection;
  Am_Object clipboard;
  clipboard = cmd.Get(Am_CLIPBOARD);
  if (!clipboard.Valid())
    clipboard = Am_Global_Clipboard;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  group = selection_widget.Get(Am_OPERATES_ON);
  clipboard_objs = clipboard.Get(Am_VALUE);
  copy_clipboard_objs = Am_Copy_Object_List(clipboard_objs);
  cmd.Set(Am_OBJECT_MODIFIED, Am_No_Object); //not used
  cmd.Set(Am_HAS_BEEN_UNDONE, false);
  Am_Put_Objects_Into_Group(group, copy_clipboard_objs);
  old_selection = selection_widget.Get(Am_VALUE);
  cmd.Set(Am_OLD_VALUE, old_selection);
  cmd.Set(Am_VALUE, copy_clipboard_objs);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  selection_widget.Set(Am_VALUE, copy_clipboard_objs);
}